

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O3

void write_image_inside(Fl_RGB_Image *to,Fl_RGB_Image *from,int to_x,int to_y)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  int iVar4;
  int iVar5;
  uchar *__dest;
  int iVar6;
  uchar *__src;
  
  iVar3 = (to->super_Fl_Image).ld_;
  if (iVar3 == 0) {
    iVar3 = (to->super_Fl_Image).d_ * (to->super_Fl_Image).w_;
  }
  iVar5 = (from->super_Fl_Image).ld_;
  if (iVar5 == 0) {
    iVar5 = (from->super_Fl_Image).d_ * (from->super_Fl_Image).w_;
  }
  iVar6 = (from->super_Fl_Image).h_;
  if (0 < iVar6) {
    __src = from->array + (iVar6 + -1) * iVar5;
    __dest = to->array + (long)to_x * (long)(to->super_Fl_Image).d_ + (long)(to_y * iVar3);
    do {
      iVar4 = (from->super_Fl_Image).w_;
      iVar1 = (from->super_Fl_Image).d_;
      if (iVar1 == (to->super_Fl_Image).d_) {
        memcpy(__dest,__src,(long)(iVar4 * iVar1));
      }
      else if (0 < iVar4) {
        iVar4 = 0;
        do {
          __n = (size_t)(from->super_Fl_Image).d_;
          memcpy(__dest + (long)(to->super_Fl_Image).d_ * (long)iVar4,__src + __n * (long)iVar4,__n)
          ;
          iVar4 = iVar4 + 1;
        } while (iVar4 < (from->super_Fl_Image).w_);
      }
      __dest = __dest + iVar3;
      __src = __src + -(long)iVar5;
      bVar2 = 1 < iVar6;
      iVar6 = iVar6 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

static void write_image_inside(Fl_RGB_Image *to, Fl_RGB_Image *from, int to_x, int to_y)
/* Copy the image "from" inside image "to" with its top-left angle at coordinates to_x, to_y.
 Also, exchange top and bottom of "from". Image depth can differ between "to" and "from".
 */
{
  int to_ld = (to->ld() == 0? to->w() * to->d() : to->ld());
  int from_ld = (from->ld() == 0? from->w() * from->d() : from->ld());
  uchar *tobytes = (uchar*)to->array + to_y * to_ld + to_x * to->d();
  const uchar *frombytes = from->array + (from->h() - 1) * from_ld;
  for (int i = from->h() - 1; i >= 0; i--) {
    if (from->d() == to->d()) memcpy(tobytes, frombytes, from->w() * from->d());
    else {
      for (int j = 0; j < from->w(); j++) {
        memcpy(tobytes + j * to->d(), frombytes + j * from->d(), from->d());
      }
    }
    tobytes += to_ld;
    frombytes -= from_ld;
  }
}